

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imapControl.cc
# Opt level: O2

int __thiscall imapControl::run(imapControl *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  sendUtil *this_00;
  FILE *__n;
  void *__buf;
  int iVar4;
  int in_R8D;
  uint uVar5;
  char newURL [1024];
  
  free((this->bufferInfo).buffer);
  (this->bufferInfo).buffer = (char *)0x0;
  (this->bufferInfo).size = 1;
  uVar2 = curl_easy_perform(this->examineMailbox);
  if (uVar2 == 0) {
    uVar2 = parseExamineRequest(this);
    if (uVar2 == 0) {
      iVar1 = this->highestmodseq;
      iVar4 = 0;
      if (iVar1 != this->oldHighestmodseq) {
        memset(newURL,0,0x400);
        this->oldHighestmodseq = iVar1;
        uVar2 = this->newestUID;
        uVar5 = 5;
        if (5 < (int)uVar2) {
          uVar5 = uVar2;
        }
        for (; (int)(uVar5 - 5) < (int)uVar2; uVar2 = uVar2 - 1) {
          free((this->bufferInfo).buffer);
          (this->bufferInfo).buffer = (char *)0x0;
          (this->bufferInfo).size = 1;
          __n = (FILE *)(ulong)uVar2;
          snprintf(newURL,0x400,"imaps://imap.server.com/INBOX;UID=%d");
          uVar3 = curl_easy_setopt(this->getEmail,0x2712,newURL);
          if (uVar3 != 0) {
            __n = (FILE *)&stderr;
            fprintf(_stderr,"curl_easy_setopt returned error! Code: %d\n",(ulong)uVar3);
          }
          uVar3 = curl_easy_perform(this->getEmail);
          if (uVar3 == 0) {
LAB_00110fb8:
            uVar3 = parseEmail(this);
            if (1 < (int)uVar3) {
              fprintf(_stdout,"parsing of email found nothing to trigger a command: %d\n",
                      (ulong)uVar3);
              break;
            }
            if (uVar3 == 1) {
              doCommand(this);
              this_00 = (sendUtil *)operator_new(8);
              iVar4 = 0x1133a3;
              sendUtil::sendUtil(this_00,"Subject: Command executed",(this->bufferInfo).buffer);
              sendUtil::send(this_00,iVar4,__buf,(size_t)__n,in_R8D);
              sendUtil::~sendUtil(this_00);
              operator_delete(this_00,8);
              break;
            }
          }
          else {
            fprintf(_stderr,"Mailbox read failed: %d\n",(ulong)uVar3);
            if (uVar3 == 0x4e) {
              uVar3 = curl_easy_perform(this->getEmail);
            }
            if (uVar3 == 0) {
              __n = _stderr;
              fwrite("Reread was successful\n",0x16,1,_stderr);
              goto LAB_00110fb8;
            }
            if (uVar3 != 0x4e) {
              return 3;
            }
            fprintf(_stderr,"command was: %s\n",newURL);
            if ((this->bufferInfo).buffer == (char *)0x0) {
              fwrite("no returned data\n",0x11,1,_stderr);
            }
            else {
              fprintf(_stderr,"received: %s\n");
            }
          }
        }
        iVar4 = 0;
      }
    }
    else {
      fprintf(_stderr,"parsing of mailbox examination results failed: %d\n",(ulong)uVar2);
      iVar4 = 2;
    }
  }
  else {
    iVar4 = 0;
    fprintf(_stderr,"Mailbox examination failed: %d, skip this cycle\n",(ulong)uVar2);
  }
  return iVar4;
}

Assistant:

int imapControl::run() {
  free(bufferInfo.buffer);
  bufferInfo.buffer = 0;
  bufferInfo.size = 1;
  int returnCode = curl_easy_perform(examineMailbox);
  if (returnCode) {
    fprintf(stderr, "Mailbox examination failed: %d, skip this cycle\n", returnCode);
    return 0;  // used to be 1, this terminated the process more often than I expected
  }
  returnCode = parseExamineRequest();
  if (returnCode) {
    fprintf(stderr, "parsing of mailbox examination results failed: %d\n", returnCode);
    return 2;
  }
  if (highestmodseq != oldHighestmodseq) {  // something has changed, see if new mail has a request
    char newURL[1024];
    memset(newURL, 0, sizeof(newURL));
    oldHighestmodseq = highestmodseq;
    int readNoMore = std::max(0, newestUID - MAX_EMAILS);  // limit how many emails are read (no more than MAX_EMAILS)
    for (int uid = newestUID; uid > readNoMore; uid--) {
      free(bufferInfo.buffer);
      bufferInfo.buffer = 0;
      bufferInfo.size = 1;
      if (!debug) {
        snprintf(newURL, sizeof(newURL), "imaps://" STR_VALUE(IMAP_URL)"/INBOX;UID=%d", uid);
        int rc = curl_easy_setopt(getEmail, CURLOPT_URL, newURL);
        if (rc) {
          fprintf(stderr, "curl_easy_setopt returned error! Code: %d\n", rc);
        }
      }
      returnCode = curl_easy_perform(getEmail);
      if (returnCode) {
        fprintf(stderr, "Mailbox read failed: %d\n", returnCode);
        if (returnCode == 78) {  // let's try one more time
          returnCode = curl_easy_perform(getEmail);
        }
        if (returnCode == 78) {  // did not find the email at this UID
          fprintf(stderr, "command was: %s\n", newURL);
          if (bufferInfo.buffer == 0) {
            fprintf(stderr, "no returned data\n");
          } else {
            fprintf(stderr, "received: %s\n", bufferInfo.buffer);
          }
          continue;  // continue with next UID
        } else {
          if (returnCode) {
            return 3;  // fail out - this was bad
          }
          fprintf(stderr, "Reread was successful\n");
        }
      }
      returnCode = parseEmail();
      if (returnCode > 1) {
        fprintf(stdout, "parsing of email found nothing to trigger a command: %d\n", returnCode);
        break;
      }
      if (returnCode == 1) {  // command found
        doCommand();
        sendUtil * sendUtilInstance = new sendUtil("Subject: Command executed", bufferInfo.buffer);
        if (debug) fprintf(stdout, "%s\n", bufferInfo.buffer);
        sendUtilInstance->send();
        delete(sendUtilInstance);
        break;
      }
    }
  }
  return 0;  // if mail reads worked, return ok
}